

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeData(BtCursor *pCur,u32 offset,u32 amt,void *pBuf)

{
  int local_30;
  int local_2c;
  int rc;
  void *pBuf_local;
  u32 amt_local;
  u32 offset_local;
  BtCursor *pCur_local;
  
  if (pCur->eState == '\0') {
    pCur_local._4_4_ = 4;
  }
  else {
    if (pCur->eState < 2) {
      local_30 = 0;
    }
    else {
      local_30 = btreeRestoreCursorPosition(pCur);
    }
    local_2c = local_30;
    if (local_30 == 0) {
      local_2c = accessPayload(pCur,offset,amt,(uchar *)pBuf,0);
    }
    pCur_local._4_4_ = local_2c;
  }
  return pCur_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeData(BtCursor *pCur, u32 offset, u32 amt, void *pBuf){
  int rc;

#ifndef SQLITE_OMIT_INCRBLOB
  if ( pCur->eState==CURSOR_INVALID ){
    return SQLITE_ABORT;
  }
#endif

  assert( cursorHoldsMutex(pCur) );
  rc = restoreCursorPosition(pCur);
  if( rc==SQLITE_OK ){
    assert( pCur->eState==CURSOR_VALID );
    assert( pCur->iPage>=0 && pCur->apPage[pCur->iPage] );
    assert( pCur->aiIdx[pCur->iPage]<pCur->apPage[pCur->iPage]->nCell );
    rc = accessPayload(pCur, offset, amt, pBuf, 0);
  }
  return rc;
}